

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void __thiscall
helics::LogManager::updateRemote(LogManager *this,GlobalFederateId destination,int level)

{
  int iVar1;
  pointer ppVar2;
  pair<helics::GlobalFederateId,_int> *rl;
  int local_10;
  GlobalFederateId local_c;
  
  ppVar2 = (this->remoteTargets).
           super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppVar2 == (this->remoteTargets).
                  super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      local_10 = level;
      local_c.gid = destination.gid;
      std::
      vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
      ::emplace_back<helics::GlobalFederateId&,int&>
                ((vector<std::pair<helics::GlobalFederateId,int>,std::allocator<std::pair<helics::GlobalFederateId,int>>>
                  *)&this->remoteTargets,&local_c,&local_10);
      iVar1 = this->fileLogLevel;
      if (this->fileLogLevel < this->consoleLogLevel) {
        iVar1 = this->consoleLogLevel;
      }
      for (ppVar2 = (this->remoteTargets).
                    super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppVar2 != (this->remoteTargets).
                    super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; ppVar2 = ppVar2 + 1) {
        if (iVar1 < ppVar2->second) {
          iVar1 = ppVar2->second;
        }
      }
      LOCK();
      (this->maxLogLevel).super___atomic_base<int>._M_i = iVar1;
      UNLOCK();
      return;
    }
    if ((ppVar2->first).gid == destination.gid) break;
    ppVar2 = ppVar2 + 1;
  }
  ppVar2->second = level;
  return;
}

Assistant:

void LogManager::updateRemote(GlobalFederateId destination, int level)
{
    for (auto& rl : remoteTargets) {
        if (rl.first == destination) {
            rl.second = level;
            return;
        }
    }
    remoteTargets.emplace_back(destination, level);
    updateMaxLogLevel();
}